

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O2

void __thiscall
Style::Style::parseFields
          (Style *this,xml_node<char> *def,
          unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
          *fields)

{
  xml_node<char> *pxVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  xml_node<char> *this_00;
  logic_error *plVar5;
  char *pcVar6;
  xml_node<char> *pxVar7;
  allocator<char> local_169;
  Field field;
  __hashtable *__h;
  string attrVal;
  u16string name;
  string attrName;
  
  this_00 = def->m_first_node;
  while( true ) {
    if (this_00 == (xml_node<char> *)0x0) {
      return;
    }
    pcVar6 = (this_00->super_xml_base<char>).m_name;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    iVar3 = strcmp(pcVar6,"bcf:field");
    if (iVar3 != 0) break;
    pcVar6 = (this_00->super_xml_base<char>).m_value;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&attrName,pcVar6,(allocator<char> *)&field);
    UtfHandler::utf8to16(&name,&this->utf,&attrName);
    std::__cxx11::string::~string((string *)&attrName);
    Field::Field(&field,&name);
    pxVar1 = (xml_node<char> *)this_00->m_first_attribute;
    while (pxVar7 = pxVar1, pxVar7 != (xml_node<char> *)0x0) {
      pcVar6 = (pxVar7->super_xml_base<char>).m_name;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&attrName,pcVar6,(allocator<char> *)&attrVal);
      pcVar6 = (pxVar7->super_xml_base<char>).m_value;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&attrVal,pcVar6,&local_169);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &attrName,"fieldtype");
      if (bVar2) {
        bVar2 = std::operator==(&attrVal,"field");
        if (bVar2) {
          field.type = Field;
        }
        else {
          bVar2 = std::operator==(&attrVal,"list");
          if (!bVar2) {
            plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar5,"Unexpected result");
            __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          field.type = List;
        }
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&attrName,"datatype");
        if (bVar2) {
          bVar2 = std::operator==(&attrVal,"literal");
          if (bVar2) {
            field.dataType = Literal;
          }
          else {
            bVar2 = std::operator==(&attrVal,"name");
            if (bVar2) {
              field.dataType = Name;
            }
            else {
              bVar2 = std::operator==(&attrVal,"key");
              if (bVar2) {
                field.dataType = Key;
              }
              else {
                bVar2 = std::operator==(&attrVal,"entrykey");
                if (bVar2) {
                  field.dataType = EntryKey;
                }
                else {
                  bVar2 = std::operator==(&attrVal,"date");
                  if (bVar2) {
                    field.dataType = Date;
                  }
                  else {
                    bVar2 = std::operator==(&attrVal,"verbatim");
                    if (bVar2) {
                      field.dataType = Verbatim;
                    }
                    else {
                      bVar2 = std::operator==(&attrVal,"integer");
                      if (bVar2) {
                        field.dataType = Integer;
                      }
                      else {
                        bVar2 = std::operator==(&attrVal,"range");
                        if (bVar2) {
                          field.dataType = Range;
                        }
                        else {
                          bVar2 = std::operator==(&attrVal,"code");
                          if (bVar2) {
                            field.dataType = Code;
                          }
                          else {
                            bVar2 = std::operator==(&attrVal,"uri");
                            if (bVar2) {
                              field.dataType = URI;
                            }
                            else {
                              bVar2 = std::operator==(&attrVal,"datepart");
                              if (bVar2) {
                                field.dataType = Datepart;
                              }
                              else {
                                bVar2 = std::operator==(&attrVal,"keyword");
                                if (bVar2) {
                                  field.dataType = Keyword;
                                }
                                else {
                                  bVar2 = std::operator==(&attrVal,"option");
                                  if (bVar2) {
                                    field.dataType = Option;
                                  }
                                  else {
                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                             "Unhandled datatype ");
                                    poVar4 = std::operator<<(poVar4,(string *)&attrVal);
                                    std::operator<<(poVar4,"\n");
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&attrName,"format");
          if (bVar2) {
            bVar2 = std::operator==(&attrVal,"xsv");
            if (bVar2) {
              field.format = XSV;
            }
            else {
              poVar4 = std::operator<<((ostream *)&std::cerr,"Unhandled format ");
              poVar4 = std::operator<<(poVar4,(string *)&attrVal);
              std::operator<<(poVar4,"\n");
              field.format = Other;
            }
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&attrName,"nullok");
            if (bVar2) {
              bVar2 = std::operator==(&attrVal,"true");
              if (bVar2) {
                field.nullok = true;
              }
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&attrName,"skip_out");
              if (bVar2) {
                bVar2 = std::operator==(&attrVal,"true");
                if (bVar2) {
                  field.skipout = true;
                }
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&attrName,"label");
                if ((bVar2) && (bVar2 = std::operator==(&attrVal,"true"), bVar2)) {
                  field.label = true;
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&attrVal);
      std::__cxx11::string::~string((string *)&attrName);
      pxVar1 = (pxVar7->super_xml_base<char>).m_parent;
      if (pxVar1 != (xml_node<char> *)0x0) {
        pxVar1 = pxVar7->m_first_node;
      }
    }
    std::
    pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>
    ::
    pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_&,_Style::Field_&,_true>
              ((pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>
                *)&attrName,&name,&field);
    std::
    _Hashtable<std::__cxx11::u16string,std::pair<std::__cxx11::u16string_const,Style::Field>,std::allocator<std::pair<std::__cxx11::u16string_const,Style::Field>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::u16string>,std::hash<std::__cxx11::u16string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::u16string_const,Style::Field>>
              ((_Hashtable<std::__cxx11::u16string,std::pair<std::__cxx11::u16string_const,Style::Field>,std::allocator<std::pair<std::__cxx11::u16string_const,Style::Field>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::u16string>,std::hash<std::__cxx11::u16string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)fields);
    std::
    pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>
    ::~pair((pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>
             *)&attrName);
    Field::~Field(&field);
    std::__cxx11::u16string::~u16string((u16string *)&name);
    this_00 = rapidxml::xml_node<char>::next_sibling(this_00,(char *)0x0,0,true);
  }
  plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar5,"Unexpected node name");
  __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void Style::parseFields (xml_node<> *def, unordered_map<u16string, Field> &fields) {
    for (xml_node<> *node = def->first_node(); node; node = node->next_sibling()) {
        EXPECT_NAME(node, "bcf:field");

        u16string name = utf.utf8to16(node->value());
        Field field { name };

        for (xml_attribute<> *attr = node->first_attribute(); attr; attr = attr->next_attribute()) {
            string attrName = attr->name();
            string attrVal = attr->value();

            if (attrName == "fieldtype") {
                if (attrVal == "field") {
                    field.type = Field::Type::Field;
                } else {
                    ASSERT(attrVal == "list");
                    field.type = Field::Type::List;
                }
            } else if (attrName == "datatype") {
                if (attrVal == "literal") {
                    field.dataType = Field::Data::Literal;
                } else if (attrVal == "name") {
                    field.dataType = Field::Data::Name;
                } else if (attrVal == "key") {
                    field.dataType = Field::Data::Key;
                } else if (attrVal == "entrykey") {
                    field.dataType = Field::Data::EntryKey;
                } else if (attrVal == "date") {
                    field.dataType = Field::Data::Date;
                } else if (attrVal == "verbatim") {
                    field.dataType = Field::Data::Verbatim;
                } else if (attrVal == "integer") {
                    field.dataType = Field::Data::Integer;
                } else if (attrVal == "range") {
                    field.dataType = Field::Data::Range;
                } else if (attrVal == "code") {
                    field.dataType = Field::Data::Code;
                } else if (attrVal == "uri") {
                    field.dataType = Field::Data::URI;
                } else if (attrVal == "datepart") {
                    field.dataType = Field::Data::Datepart;
                } else if (attrVal == "keyword") {
                    field.dataType = Field::Data::Keyword;
                } else if (attrVal == "option") {
                    field.dataType = Field::Data::Option;
                } else {
                    std::cerr << "Unhandled datatype " << attrVal << "\n";
                }
            } else if (attrName == "format") {
                if (attrVal == "xsv") {
                    field.format = Field::Format::XSV;
                } else {
                    std::cerr << "Unhandled format " << attrVal << "\n";
                    field.format = Field::Format::Other;
                }
            } else if (attrName == "nullok") {
                // NOTE: Technically the schema does not allow any other value besides "true",
                //  so the check is useless
                if (attrVal == "true") field.nullok = true;
            } else if (attrName == "skip_out") {
                if (attrVal == "true") field.skipout = true;
            } else if (attrName == "label") {
                if (attrVal == "true") field.label = true;
            }
        }

        fields.insert({ name, field });
    }
}